

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

void xmlParseMisc(xmlParserCtxtPtr ctxt)

{
  xmlParserCtxtPtr ctxt_local;
  
  while( true ) {
    while( true ) {
      if (1 < ctxt->disableSAX) {
        return;
      }
      xmlSkipBlankChars(ctxt);
      if (((ctxt->input->flags & 0x40U) == 0) &&
         ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
        xmlParserGrow(ctxt);
      }
      if ((*ctxt->input->cur != '<') || (ctxt->input->cur[1] != '?')) break;
      xmlParsePI(ctxt);
    }
    if (*ctxt->input->cur != '<') {
      return;
    }
    if (ctxt->input->cur[1] != '!') {
      return;
    }
    if (ctxt->input->cur[2] != '-') break;
    if (ctxt->input->cur[3] != '-') {
      return;
    }
    xmlParseComment(ctxt);
  }
  return;
}

Assistant:

void
xmlParseMisc(xmlParserCtxtPtr ctxt) {
    while (PARSER_STOPPED(ctxt) == 0) {
        SKIP_BLANKS;
        GROW;
        if ((RAW == '<') && (NXT(1) == '?')) {
	    xmlParsePI(ctxt);
        } else if (CMP4(CUR_PTR, '<', '!', '-', '-')) {
	    xmlParseComment(ctxt);
        } else {
            break;
        }
    }
}